

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

bool glcts::PipelineStatisticsQueryUtilities::isInstancedDrawCall(_draw_call_type draw_call)

{
  undefined1 local_e;
  bool result;
  _draw_call_type draw_call_local;
  
  local_e = true;
  if ((((draw_call != DRAW_CALL_TYPE_GLDRAWARRAYSINDIRECT) &&
       (local_e = true, draw_call != DRAW_CALL_TYPE_GLDRAWARRAYSINSTANCED)) &&
      (local_e = true, draw_call != DRAW_CALL_TYPE_GLDRAWARRAYSINSTANCEDBASEINSTANCE)) &&
     (((local_e = true, draw_call != DRAW_CALL_TYPE_GLDRAWELEMENTSINDIRECT &&
       (local_e = true, draw_call != DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCED)) &&
      (local_e = true, draw_call != DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCEDBASEINSTANCE)))) {
    local_e = draw_call == DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCE;
  }
  return local_e;
}

Assistant:

bool PipelineStatisticsQueryUtilities::isInstancedDrawCall(_draw_call_type draw_call)
{
	bool result =
		(draw_call == PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_GLDRAWARRAYSINDIRECT ||
		 draw_call == PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_GLDRAWARRAYSINSTANCED ||
		 draw_call == PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_GLDRAWARRAYSINSTANCEDBASEINSTANCE ||
		 draw_call == PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_GLDRAWELEMENTSINDIRECT ||
		 draw_call == PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCED ||
		 draw_call == PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCEDBASEINSTANCE ||
		 draw_call == PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCE);

	return result;
}